

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_aspect.c
# Opt level: O0

int log_aspect_notify_first
              (log_aspect aspect,log_aspect_notify_cb notify_cb,log_aspect_notify_data notify_data)

{
  int iVar1;
  undefined8 in_RDX;
  code *in_RSI;
  long in_RDI;
  size_t iterator;
  ulong local_28;
  
  local_28 = 0;
  while( true ) {
    if (*(ulong *)(in_RDI + 0x18) <= local_28) {
      return 1;
    }
    if ((*(long *)(*(long *)(in_RDI + 0x10) + local_28 * 8) != 0) &&
       (iVar1 = (*in_RSI)(in_RDI,*(undefined8 *)(*(long *)(in_RDI + 0x10) + local_28 * 8),in_RDX),
       iVar1 == 0)) break;
    local_28 = local_28 + 1;
  }
  return 0;
}

Assistant:

int log_aspect_notify_first(log_aspect aspect, log_aspect_notify_cb notify_cb, log_aspect_notify_data notify_data)
{
	size_t iterator;

	for (iterator = 0; iterator < aspect->count; ++iterator)
	{
		if (aspect->policies[iterator] != NULL)
		{
			if (notify_cb(aspect, aspect->policies[iterator], notify_data) == 0)
			{
				return 0;
			}
		}
	}

	return 1;
}